

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_mirjit.c
# Opt level: O2

int raviV_initjit(lua_State *L)

{
  global_State *pgVar1;
  FILE *__stream;
  int iVar2;
  ravi_State *prVar3;
  MIR_context_t pMVar4;
  double dVar5;
  undefined8 uVar6;
  
  pgVar1 = L->l_G;
  if (pgVar1->ravi_state == (ravi_State *)0x0) {
    prVar3 = (ravi_State *)calloc(1,0x88);
    prVar3->min_code_size_ = 0x96;
    prVar3->min_exec_count_ = 0x32;
    *(undefined2 *)&prVar3->field_0x10 = 0x50;
    dVar5 = (double)_MIR_get_api_version();
    __stream = _stderr;
    if ((dVar5 != 0.2) || (NAN(dVar5))) {
      uVar6 = _MIR_get_api_version();
      fprintf(__stream,
              "mir.h header has version %g different from used mir code version %g -- good bye!\n",
              0x3fc999999999999a,uVar6);
      exit(1);
    }
    pMVar4 = (MIR_context_t)_MIR_init();
    prVar3->jit = pMVar4;
    iVar2 = 0;
    pgVar1->ravi_state = prVar3;
  }
  else {
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int raviV_initjit(struct lua_State *L) {
  global_State *G = G(L);
  if (G->ravi_state != NULL)
    return -1;
  ravi_State *jit = (ravi_State *)calloc(1, sizeof(ravi_State));
  jit->auto_ = 0;
  jit->enabled_ = 1;
  jit->min_code_size_ = 150;
  jit->min_exec_count_ = 50;
  jit->opt_level_ = 2;
  // The parameter true means we will be dumping stuff as we compile
  jit->jit = MIR_init();
  G->ravi_state = jit;
  return 0;
}